

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoDecompress.c
# Opt level: O3

UINT16 MakeTable(SCRATCH_DATA *Sd,UINT16 NumOfChar,UINT8 *BitLen,UINT16 TableBits,UINT16 *Table)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  short sVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  UINT16 UVar13;
  undefined6 in_register_00000032;
  UINT16 *pUVar14;
  ulong uVar15;
  ushort uVar16;
  UINT16 Start [18];
  UINT16 Count [17];
  UINT16 Weight [17];
  ushort local_b8 [24];
  ushort local_88 [23];
  short asStack_5a [21];
  
  uVar11 = CONCAT62(in_register_00000032,NumOfChar) & 0xffffffff;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  local_88[0x10] = 0;
  if ((int)CONCAT62(in_register_00000032,NumOfChar) != 0) {
    uVar8 = 0;
    do {
      if (0x10 < (ulong)BitLen[uVar8]) {
        return 0xffff;
      }
      local_88[BitLen[uVar8]] = local_88[BitLen[uVar8]] + 1;
      uVar8 = uVar8 + 1;
    } while (NumOfChar != uVar8);
  }
  local_b8[0] = 0;
  local_b8[1] = 0;
  bVar5 = 0xf;
  lVar4 = 0;
  iVar9 = 0;
  do {
    iVar9 = iVar9 + ((uint)local_88[lVar4 + 1] << (bVar5 & 0x1f));
    local_b8[lVar4 + 2] = (ushort)iVar9;
    lVar4 = lVar4 + 1;
    bVar5 = bVar5 - 1;
  } while (lVar4 != 0x10);
  if (local_b8[0x11] != 0) {
    return 0xffff;
  }
  bVar5 = (byte)TableBits;
  bVar6 = 0x10 - bVar5;
  asStack_5a[1] = 0;
  if (TableBits == 0) {
    uVar12 = 1;
  }
  else {
    uVar16 = TableBits + 1;
    uVar12 = 2;
    if (2 < uVar16) {
      uVar12 = uVar16;
    }
    uVar8 = 1;
    UVar13 = TableBits;
    do {
      UVar13 = UVar13 - 1;
      local_b8[uVar8] = local_b8[uVar8] >> (bVar6 & 0x1f);
      asStack_5a[uVar8 + 1] = (short)(1 << ((byte)UVar13 & 0x1f));
      uVar8 = uVar8 + 1;
    } while (uVar12 != uVar8);
    if (0x10 < uVar16) goto LAB_0019e598;
  }
  uVar8 = (ulong)uVar12;
  sVar7 = 0x10 - uVar12;
  do {
    uVar8 = uVar8 + 1;
    asStack_5a[uVar8] = (short)(1 << ((byte)sVar7 & 0x1f));
    sVar7 = sVar7 + -1;
  } while ((short)uVar8 != 0x11);
LAB_0019e598:
  uVar12 = local_b8[(ulong)TableBits + 1] >> (bVar6 & 0x1f);
  uVar10 = (uint)uVar12;
  if ((uVar12 != 0) &&
     (uVar3 = 1 << (bVar5 & 0x1f) & 0xffff, iVar9 = uVar3 - uVar10, uVar10 <= uVar3 && iVar9 != 0))
  {
    memset(Table + uVar10,0,(long)iVar9 * 2);
  }
  if ((short)uVar11 != 0) {
    uVar8 = 0;
    do {
      bVar1 = BitLen[uVar8];
      if (0xef < (byte)(bVar1 - 0x11)) {
        uVar12 = *(ushort *)((long)local_b8 + (ulong)((uint)bVar1 + (uint)bVar1));
        uVar15 = (ulong)uVar12;
        uVar16 = *(short *)((long)asStack_5a + (ulong)((uint)bVar1 + (uint)bVar1) + 2) + uVar12;
        if (TableBits < bVar1) {
          pUVar14 = Table + (uVar12 >> (bVar6 & 0x1f));
          if (bVar1 != TableBits) {
            sVar7 = TableBits - bVar1;
            do {
              uVar2 = *pUVar14;
              uVar15 = (ulong)uVar2;
              uVar10 = (uint)uVar11;
              if (uVar2 == 0) {
                uVar3 = uVar10 & 0xffff;
                if (0x3fa < uVar3) goto LAB_0019e698;
                *(undefined2 *)((long)Sd->mLeft + (ulong)(uVar3 * 2)) = 0;
                *(undefined2 *)((long)Sd->mRight + (ulong)(uVar3 * 2)) = 0;
                uVar10 = uVar3 + 1;
                *pUVar14 = (ushort)uVar11;
                uVar15 = uVar11;
LAB_0019e6a7:
                if ((uVar12 & (ushort)(0x8000 >> (bVar5 & 0x1f))) == 0) {
                  pUVar14 = Sd->mLeft;
                }
                else {
                  pUVar14 = Sd->mRight;
                }
                pUVar14 = pUVar14 + (uVar15 & 0xffff);
                uVar11 = (ulong)uVar10;
              }
              else {
LAB_0019e698:
                if (uVar2 < 0x3fb) goto LAB_0019e6a7;
              }
              uVar12 = uVar12 * 2;
              sVar7 = sVar7 + 1;
            } while (sVar7 != 0);
          }
          *pUVar14 = (ushort)uVar8;
        }
        else if (uVar12 < uVar16) {
          do {
            if ((1 << (bVar5 & 0x1f) & 0xffff) <= uVar15) {
              return 0xffff;
            }
            Table[uVar15] = (ushort)uVar8;
            uVar15 = uVar15 + 1;
          } while (uVar16 != uVar15);
        }
        local_b8[bVar1] = uVar16;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != NumOfChar);
  }
  return 0;
}

Assistant:

STATIC
UINT16
MakeTable (
    IN  SCRATCH_DATA  *Sd,
    IN  UINT16        NumOfChar,
    IN  UINT8         *BitLen,
    IN  UINT16        TableBits,
    OUT UINT16        *Table
    )
{
    UINT16  Count[17];
    UINT16  Weight[17];
    UINT16  Start[18];
    UINT16  *Pointer;
    UINT16  Index3;
    UINT16  Index;
    UINT16  Len;
    UINT16  Char;
    UINT16  JuBits;
    UINT16  Avail;
    UINT16  NextCode;
    UINT16  Mask;
    UINT16  WordOfStart;
    UINT16  WordOfCount;
    UINT16  MaxTableLength;

    //
    // The maximum mapping table width supported by this internal
    // working function is 16.
    //
    if (TableBits >= (sizeof(Count) / sizeof(UINT16))) {
        return (UINT16)BAD_TABLE;
    }

    //
    // Initialize Count array starting from Index 0, as there is a possibility of Count array being uninitialized.
    //
    for (Index = 0; Index <= 16; Index++) {
        Count[Index] = 0;
    }

    for (Index = 0; Index < NumOfChar; Index++) {
        if (BitLen[Index] > 16) {
            return (UINT16)BAD_TABLE;
        }
        Count[BitLen[Index]]++;
    }

    Start[0] = 0;
    Start[1] = 0;

    for (Index = 1; Index <= 16; Index++) {
        WordOfStart = Start[Index];
        WordOfCount = Count[Index];
        Start[Index + 1] = (UINT16)(WordOfStart + (WordOfCount << (16 - Index)));
    }

    if (Start[17] != 0) {
        /*(1U << 16)*/
        return (UINT16)BAD_TABLE;
    }

    JuBits = (UINT16)(16 - TableBits);

    Weight[0] = 0;
    for (Index = 1; Index <= TableBits; Index++) {
        Start[Index] >>= JuBits;
        Weight[Index] = (UINT16)(1U << (TableBits - Index));
    }

    while (Index <= 16) {
        Weight[Index] = (UINT16)(1U << (16 - Index));
        Index++;
    }

    Index = (UINT16)(Start[TableBits + 1] >> JuBits);

    if (Index != 0) {
        Index3 = (UINT16)(1U << TableBits);
        if (Index < Index3) {
            SetMem16 (Table + Index, (Index3 - Index) * sizeof(*Table), 0);
        }
    }

    Avail = NumOfChar;
    Mask = (UINT16)(1U << (15 - TableBits));
    MaxTableLength = (UINT16)(1U << TableBits);

    for (Char = 0; Char < NumOfChar; Char++) {
        Len = BitLen[Char];
        if (Len == 0 || Len >= 17) {
            continue;
        }

        NextCode = (UINT16)(Start[Len] + Weight[Len]);

        if (Len <= TableBits) {

            for (Index = Start[Len]; Index < NextCode; Index++) {
                if (Index >= MaxTableLength) {
                    return (UINT16)BAD_TABLE;
                }
                Table[Index] = Char;
            }

        }
        else {
            Index3 = Start[Len];
            Pointer = &Table[Index3 >> JuBits];
            Index = (UINT16)(Len - TableBits);

            while (Index != 0) {
                if (*Pointer == 0 && Avail < (2 * NC - 1)) {
                    Sd->mRight[Avail] = Sd->mLeft[Avail] = 0;
                    *Pointer = Avail++;
                }

                if (*Pointer < (2 * NC - 1)) {
                    if ((Index3 & Mask) != 0) {
                        Pointer = &Sd->mRight[*Pointer];
                    }
                    else {
                        Pointer = &Sd->mLeft[*Pointer];
                    }
                }

                Index3 <<= 1;
                Index--;
            }

            *Pointer = Char;

        }

        Start[Len] = NextCode;
    }
    //
    // Succeeds
    //
    return 0;
}